

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall iqnet::ssl::LockContainer::LockContainer(LockContainer *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  mutex *pmVar5;
  ulong uVar6;
  mutex *local_50;
  LockContainer *this_local;
  
  this->size = 1;
  uVar1 = this->size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar3 = SUB168(auVar2 * ZEXT816(0x28),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar2 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar1;
  pmVar5 = (mutex *)(puVar4 + 1);
  if (uVar1 != 0) {
    local_50 = pmVar5;
    do {
      boost::mutex::mutex(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pmVar5 + uVar1);
  }
  this->locks = pmVar5;
  return;
}

Assistant:

LockContainer():
    size(CRYPTO_num_locks()),
    locks(new boost::mutex[size])
  {
  }